

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O3

void __thiscall BVFixed::OrComplimented(BVFixed *this,BVFixed *bv)

{
  ulong *puVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  long lVar6;
  
  AssertBV(this,bv);
  BVar4 = this->len;
  if (BVar4 != bv->len) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x45,"(this->len == bv2->len)",
                       "Fatal: The 2 bitvectors should have had the same length.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    BVar4 = this->len;
  }
  WordCount(BVar4);
  lVar6 = 8;
  do {
    puVar1 = (ulong *)((long)&this->len + lVar6);
    *puVar1 = *puVar1 | ~*(ulong *)((long)&bv->len + lVar6);
    BVar4 = WordCount(this->len);
    lVar6 = lVar6 + 8;
  } while ((BVFixed *)(puVar1 + 1) != this + (ulong)BVar4 + 1);
  ClearEnd(this);
  return;
}

Assistant:

void
BVFixed::OrComplimented(const BVFixed*bv)
{
    AssertBV(bv);
    this->for_each(bv, &BVUnit::OrComplimented);
    ClearEnd();
}